

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractitemmodel.cpp
# Opt level: O3

void QAbstractItemModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  uint uVar1;
  code *pcVar2;
  long lVar3;
  undefined1 uVar4;
  bool bVar5;
  int iVar6;
  undefined8 *puVar7;
  _func_int **pp_Var8;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  undefined4 *puVar9;
  void *pvVar10;
  void *pvVar11;
  uint uVar12;
  qsizetype objectSize;
  QArrayData *data;
  QArrayDataPointer<QPersistentModelIndex> *pQVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  QArrayDataPointer<QPersistentModelIndex> local_78;
  undefined1 local_5c [20];
  QArrayDataPointer<QPersistentModelIndex> *local_48;
  QArrayDataPointer<QPersistentModelIndex> *pQStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 0) {
      puVar7 = (undefined8 *)*_a;
      if (*_a[1] == 2) {
        *puVar7 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<int>_>::metaType;
        goto switchD_0044c917_default;
      }
    }
    else {
      puVar7 = (undefined8 *)*_a;
    }
    *puVar7 = 0;
    goto switchD_0044c917_default;
  }
  if (_c == IndexOfMethod) {
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == dataChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == headerDataChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar2 == layoutChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar2 == layoutAboutToBeChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 6;
    }
    else if (pcVar2 == rowsAboutToBeInserted && lVar3 == 0) {
      *(undefined4 *)*_a = 9;
    }
    else if (pcVar2 == rowsInserted && lVar3 == 0) {
      *(undefined4 *)*_a = 10;
    }
    else if (pcVar2 == rowsAboutToBeRemoved && lVar3 == 0) {
      *(undefined4 *)*_a = 0xb;
    }
    else if (pcVar2 == rowsRemoved && lVar3 == 0) {
      *(undefined4 *)*_a = 0xc;
    }
    else if (pcVar2 == columnsAboutToBeInserted && lVar3 == 0) {
      *(undefined4 *)*_a = 0xd;
    }
    else if (pcVar2 == columnsInserted && lVar3 == 0) {
      *(undefined4 *)*_a = 0xe;
    }
    else if (pcVar2 == columnsAboutToBeRemoved && lVar3 == 0) {
      *(undefined4 *)*_a = 0xf;
    }
    else if (pcVar2 == columnsRemoved && lVar3 == 0) {
      *(undefined4 *)*_a = 0x10;
    }
    else if (pcVar2 == modelAboutToBeReset && lVar3 == 0) {
      *(undefined4 *)*_a = 0x11;
    }
    else if (pcVar2 == modelReset && lVar3 == 0) {
      *(undefined4 *)*_a = 0x12;
    }
    else if (pcVar2 == rowsAboutToBeMoved && lVar3 == 0) {
      *(undefined4 *)*_a = 0x13;
    }
    else if (pcVar2 == rowsMoved && lVar3 == 0) {
      *(undefined4 *)*_a = 0x14;
    }
    else if (pcVar2 == columnsAboutToBeMoved && lVar3 == 0) {
      *(undefined4 *)*_a = 0x15;
    }
    else if (pcVar2 == columnsMoved && lVar3 == 0) {
      *(undefined4 *)*_a = 0x16;
    }
    goto switchD_0044c917_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_0044c917_default;
  switch(_id) {
  case 0:
    pQStack_40 = (QArrayDataPointer<QPersistentModelIndex> *)_a[3];
    local_5c._12_8_ = _a[1];
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)_a[2];
    iVar6 = 0;
    goto LAB_0044d2b3;
  case 1:
    pQStack_40 = &local_78;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QPersistentModelIndex *)0x0;
    local_78.size = 0;
    local_5c._4_8_ = (QArrayData *)0x0;
    local_5c._12_8_ = _a[1];
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)_a[2];
    QMetaObject::activate(_o,&staticMetaObject,0,(void **)(local_5c + 4));
    if (&(local_78.d)->super_QArrayData == (QArrayData *)0x0) goto switchD_0044c917_default;
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
    goto switchD_0044c917_default;
    objectSize = 4;
    data = &(local_78.d)->super_QArrayData;
    goto LAB_0044d062;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      headerDataChanged((QAbstractItemModel *)_o,*_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 3:
    local_5c._12_8_ = _a[1];
    local_78.d = (Data *)CONCAT44(local_78.d._4_4_,*_a[2]);
    goto LAB_0044cfcf;
  case 4:
    local_5c._12_8_ = _a[1];
    local_78.d = (Data *)((ulong)local_78.d._4_4_ << 0x20);
LAB_0044cfcf:
    local_48 = &local_78;
    iVar6 = 3;
    goto LAB_0044d2b3;
  case 5:
    local_5c._12_8_ = &local_78;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QPersistentModelIndex *)0x0;
    local_78.size = 0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)local_5c;
    local_5c._0_4_ = 0;
    local_5c._4_8_ = (QArrayData *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,3,(void **)(local_5c + 4));
    goto LAB_0044d335;
  case 6:
    local_5c._12_8_ = _a[1];
    local_78.d = (Data *)CONCAT44(local_78.d._4_4_,*_a[2]);
    goto LAB_0044d26a;
  case 7:
    local_5c._12_8_ = _a[1];
    local_78.d = (Data *)((ulong)local_78.d._4_4_ << 0x20);
LAB_0044d26a:
    local_48 = &local_78;
    iVar6 = 6;
    goto LAB_0044d2b3;
  case 8:
    local_5c._12_8_ = &local_78;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QPersistentModelIndex *)0x0;
    local_78.size = 0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)local_5c;
    local_5c._0_4_ = 0;
    local_5c._4_8_ = (QArrayData *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,6,(void **)(local_5c + 4));
LAB_0044d335:
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_78);
    goto switchD_0044c917_default;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      rowsAboutToBeInserted((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      rowsInserted((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0xb:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      rowsAboutToBeRemoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0xc:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      rowsRemoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0xd:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      columnsAboutToBeInserted((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0xe:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      columnsInserted((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0xf:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      columnsAboutToBeRemoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0x10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      columnsRemoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0x11:
    local_5c._12_8_ = &local_78;
    iVar6 = 0x11;
    goto LAB_0044d2b3;
  case 0x12:
    local_5c._12_8_ = &local_78;
    iVar6 = 0x12;
LAB_0044d2b3:
    local_5c._4_8_ = (QArrayData *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar6,(void **)(local_5c + 4));
    goto switchD_0044c917_default;
  case 0x13:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      rowsAboutToBeMoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3],_a[4],*_a[5]);
      return;
    }
    break;
  case 0x14:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      rowsMoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3],_a[4],*_a[5]);
      return;
    }
    break;
  case 0x15:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      columnsAboutToBeMoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3],_a[4],*_a[5]);
      return;
    }
    break;
  case 0x16:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      columnsMoved((QAbstractItemModel *)_o,_a[1],*_a[2],*_a[3],_a[4],*_a[5]);
      return;
    }
    break;
  case 0x17:
    iVar6 = (*_o->_vptr_QObject[0x2e])(_o);
    uVar4 = (undefined1)iVar6;
    goto LAB_0044d6e6;
  case 0x18:
    UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0x2f];
    goto LAB_0044cefc;
  case 0x19:
    UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0x30];
LAB_0044cefc:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      (*UNRECOVERED_JUMPTABLE_00)(_o);
      return;
    }
    break;
  case 0x1a:
    uVar1 = *_a[1];
    uVar12 = *_a[2];
    if (-1 < (int)(uVar12 | uVar1)) {
      puVar9 = (undefined4 *)_a[3];
      iVar6 = (*_o->_vptr_QObject[0xf])(_o,puVar9);
      if ((int)uVar1 < iVar6) {
        pp_Var8 = _o->_vptr_QObject;
        goto LAB_0044d61a;
      }
    }
LAB_0044d627:
    bVar5 = false;
    goto LAB_0044d629;
  case 0x1b:
    uVar1 = *_a[1];
    uVar12 = *_a[2];
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    if (((int)(uVar12 | uVar1) < 0) ||
       (iVar6 = (*_o->_vptr_QObject[0xf])(_o,local_5c + 4), iVar6 <= (int)uVar1)) goto LAB_0044d627;
    pp_Var8 = _o->_vptr_QObject;
    puVar9 = (undefined4 *)(local_5c + 4);
LAB_0044d61a:
    iVar6 = (*pp_Var8[0x10])(_o,puVar9);
    bVar5 = (int)uVar12 < iVar6;
LAB_0044d629:
    if (*_a != (void *)0x0) {
      *(bool *)*_a = bVar5;
    }
    goto switchD_0044c917_default;
  case 0x1c:
    uVar1 = *_a[1];
    uVar12 = *_a[2];
    pQVar13 = (QArrayDataPointer<QPersistentModelIndex> *)_a[3];
    goto LAB_0044d573;
  case 0x1d:
    uVar1 = *_a[1];
    uVar12 = *_a[2];
    pQVar13 = &local_78;
    local_78.d = (Data *)0xffffffffffffffff;
    local_78.ptr = (QPersistentModelIndex *)0x0;
    local_78.size = 0;
LAB_0044d573:
    local_5c._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_5c._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    (*_o->_vptr_QObject[0xc])(local_5c + 4,_o,(ulong)uVar1,(ulong)uVar12,pQVar13);
    goto LAB_0044d57c;
  case 0x1e:
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_5c._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_5c._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*_o->_vptr_QObject[0xd])(local_5c + 4,_o,_a[1]);
    goto LAB_0044d57c;
  case 0x1f:
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_5c._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_5c._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*_o->_vptr_QObject[0xe])(local_5c + 4,_o,(ulong)*_a[1],(ulong)*_a[2],_a[3]);
LAB_0044d57c:
    puVar7 = (undefined8 *)*_a;
    if (puVar7 != (undefined8 *)0x0) {
      puVar7[2] = local_48;
      *puVar7 = local_5c._4_8_;
      puVar7[1] = local_5c._12_8_;
    }
    goto switchD_0044c917_default;
  case 0x20:
    puVar9 = (undefined4 *)_a[1];
    goto LAB_0044d377;
  case 0x21:
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0044d377:
    iVar6 = (*_o->_vptr_QObject[0xf])(_o,puVar9);
LAB_0044d380:
    if ((int *)*_a != (int *)0x0) {
      *(int *)*_a = iVar6;
    }
    goto switchD_0044c917_default;
  case 0x22:
    puVar9 = (undefined4 *)_a[1];
    goto LAB_0044cca4;
  case 0x23:
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0044cca4:
    iVar6 = (*_o->_vptr_QObject[0x10])(_o,puVar9);
    goto LAB_0044d380;
  case 0x24:
    puVar9 = (undefined4 *)_a[1];
    goto LAB_0044cbbf;
  case 0x25:
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0044cbbf:
    iVar6 = (*_o->_vptr_QObject[0x11])(_o,puVar9);
    uVar4 = (undefined1)iVar6;
    goto LAB_0044d6e6;
  case 0x26:
    pvVar11 = _a[1];
    uVar14 = (ulong)*_a[2];
    pp_Var8 = _o->_vptr_QObject;
    goto LAB_0044d5c1;
  case 0x27:
    pvVar11 = _a[1];
    pp_Var8 = _o->_vptr_QObject;
    uVar14 = 0;
LAB_0044d5c1:
    pQStack_40 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_5c._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_5c._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*pp_Var8[0x12])(local_5c + 4,_o,pvVar11,uVar14);
LAB_0044d5c7:
    if ((QVariant *)*_a != (QVariant *)0x0) {
      ::QVariant::operator=((QVariant *)*_a,(QVariant *)(local_5c + 4));
    }
    ::QVariant::~QVariant((QVariant *)(local_5c + 4));
    goto switchD_0044c917_default;
  case 0x28:
    pvVar11 = _a[1];
    pvVar10 = _a[2];
    uVar14 = (ulong)*_a[3];
    pp_Var8 = _o->_vptr_QObject;
    goto LAB_0044d0e8;
  case 0x29:
    pvVar11 = _a[1];
    pvVar10 = _a[2];
    pp_Var8 = _o->_vptr_QObject;
    uVar14 = 2;
LAB_0044d0e8:
    iVar6 = (*pp_Var8[0x13])(_o,pvVar11,pvVar10,uVar14);
    uVar4 = (undefined1)iVar6;
    goto LAB_0044d6e6;
  case 0x2a:
    uVar1 = *_a[1];
    uVar12 = *_a[2];
    uVar14 = (ulong)*_a[3];
    pp_Var8 = _o->_vptr_QObject;
    goto LAB_0044d4bc;
  case 0x2b:
    uVar1 = *_a[1];
    uVar12 = *_a[2];
    pp_Var8 = _o->_vptr_QObject;
    uVar14 = 0;
LAB_0044d4bc:
    pQStack_40 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_5c._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_5c._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*pp_Var8[0x14])(local_5c + 4,_o,(ulong)uVar1,(ulong)uVar12,uVar14);
    goto LAB_0044d5c7;
  case 0x2c:
    uVar1 = *_a[1];
    uVar12 = *_a[2];
    puVar9 = (undefined4 *)_a[3];
    goto LAB_0044d3b2;
  case 0x2d:
    uVar1 = *_a[1];
    uVar12 = *_a[2];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0044d3b2:
    uVar14 = (ulong)uVar12;
    pp_Var8 = _o->_vptr_QObject;
LAB_0044d66c:
    iVar6 = (*pp_Var8[0x1f])(_o,(ulong)uVar1,uVar14,puVar9);
    uVar4 = (undefined1)iVar6;
    goto LAB_0044d6e6;
  case 0x2e:
    uVar1 = *_a[1];
    uVar12 = *_a[2];
    puVar9 = (undefined4 *)_a[3];
    goto LAB_0044d6ad;
  case 0x2f:
    uVar1 = *_a[1];
    uVar12 = *_a[2];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0044d6ad:
    uVar14 = (ulong)uVar12;
    pp_Var8 = _o->_vptr_QObject;
LAB_0044d6b3:
    iVar6 = (*pp_Var8[0x20])(_o,(ulong)uVar1,uVar14,puVar9);
    uVar4 = (undefined1)iVar6;
    goto LAB_0044d6e6;
  case 0x30:
    uVar1 = *_a[1];
    uVar12 = *_a[2];
    puVar9 = (undefined4 *)_a[3];
    goto LAB_0044cdfc;
  case 0x31:
    uVar1 = *_a[1];
    uVar12 = *_a[2];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0044cdfc:
    uVar14 = (ulong)uVar12;
    pp_Var8 = _o->_vptr_QObject;
LAB_0044d4eb:
    iVar6 = (*pp_Var8[0x21])(_o,(ulong)uVar1,uVar14,puVar9);
    uVar4 = (undefined1)iVar6;
    goto LAB_0044d6e6;
  case 0x32:
    uVar1 = *_a[1];
    uVar12 = *_a[2];
    puVar9 = (undefined4 *)_a[3];
    goto LAB_0044d6da;
  case 0x33:
    uVar1 = *_a[1];
    uVar12 = *_a[2];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0044d6da:
    uVar14 = (ulong)uVar12;
    pp_Var8 = _o->_vptr_QObject;
LAB_0044d6e0:
    iVar6 = (*pp_Var8[0x22])(_o,(ulong)uVar1,uVar14,puVar9);
    uVar4 = (undefined1)iVar6;
    goto LAB_0044d6e6;
  case 0x34:
    pvVar11 = _a[1];
    uVar12 = *_a[2];
    uVar14 = (ulong)*_a[3];
    pvVar10 = _a[4];
    uVar1 = *_a[5];
    pp_Var8 = _o->_vptr_QObject;
    goto LAB_0044d695;
  case 0x35:
    pvVar11 = _a[1];
    uVar1 = *_a[2];
    uVar14 = (ulong)*_a[3];
    pvVar10 = _a[4];
    uVar12 = *_a[5];
    pp_Var8 = _o->_vptr_QObject;
    goto LAB_0044cfb3;
  case 0x36:
    puVar9 = (undefined4 *)_a[2];
    uVar1 = *_a[1];
    goto LAB_0044d661;
  case 0x37:
    uVar1 = *_a[1];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0044d661:
    pp_Var8 = _o->_vptr_QObject;
    uVar14 = 1;
    goto LAB_0044d66c;
  case 0x38:
    puVar9 = (undefined4 *)_a[2];
    uVar1 = *_a[1];
    goto LAB_0044d480;
  case 0x39:
    uVar1 = *_a[1];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0044d480:
    pp_Var8 = _o->_vptr_QObject;
    uVar14 = 1;
    goto LAB_0044d6b3;
  case 0x3a:
    puVar9 = (undefined4 *)_a[2];
    uVar1 = *_a[1];
    goto LAB_0044d4e0;
  case 0x3b:
    uVar1 = *_a[1];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0044d4e0:
    pp_Var8 = _o->_vptr_QObject;
    uVar14 = 1;
    goto LAB_0044d4eb;
  case 0x3c:
    puVar9 = (undefined4 *)_a[2];
    uVar1 = *_a[1];
    goto LAB_0044d14f;
  case 0x3d:
    uVar1 = *_a[1];
    puVar9 = (undefined4 *)(local_5c + 4);
    local_5c._4_8_ = (QArrayData *)0xffffffffffffffff;
    local_5c._12_8_ = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)0x0;
LAB_0044d14f:
    pp_Var8 = _o->_vptr_QObject;
    uVar14 = 1;
    goto LAB_0044d6e0;
  case 0x3e:
    pvVar11 = _a[1];
    uVar12 = *_a[2];
    pvVar10 = _a[3];
    uVar1 = *_a[4];
    pp_Var8 = _o->_vptr_QObject;
    uVar14 = 1;
LAB_0044d695:
    iVar6 = (*pp_Var8[0x23])(_o,pvVar11,(ulong)uVar12,uVar14,pvVar10,(ulong)uVar1);
    uVar4 = (undefined1)iVar6;
    goto LAB_0044d6e6;
  case 0x3f:
    pvVar11 = _a[1];
    uVar1 = *_a[2];
    pvVar10 = _a[3];
    uVar12 = *_a[4];
    pp_Var8 = _o->_vptr_QObject;
    uVar14 = 1;
LAB_0044cfb3:
    iVar6 = (*pp_Var8[0x24])(_o,pvVar11,(ulong)uVar1,uVar14,pvVar10,(ulong)uVar12);
    uVar4 = (undefined1)iVar6;
    goto LAB_0044d6e6;
  case 0x40:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      (*_o->_vptr_QObject[0x25])(_o,_a[1]);
      return;
    }
    break;
  case 0x41:
    iVar6 = (*_o->_vptr_QObject[0x26])(_o,_a[1]);
    uVar4 = (undefined1)iVar6;
LAB_0044d6e6:
    if ((undefined1 *)*_a != (undefined1 *)0x0) {
      *(undefined1 *)*_a = uVar4;
    }
switchD_0044c917_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
    break;
  case 0x42:
    iVar6 = (*_o->_vptr_QObject[0x27])(_o,_a[1]);
    goto LAB_0044d380;
  case 0x43:
    uVar1 = *_a[1];
    uVar14 = (ulong)*_a[2];
    UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0x28];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
LAB_0044d73a:
      (*UNRECOVERED_JUMPTABLE_00)(_o,(ulong)uVar1,uVar14);
      return;
    }
    break;
  case 0x44:
    uVar1 = *_a[1];
    UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0x28];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      uVar14 = 0;
      goto LAB_0044d73a;
    }
    break;
  case 0x45:
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_5c._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_5c._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*_o->_vptr_QObject[0x2a])(local_5c + 4,_o,_a[1],(ulong)*_a[2],_a[3],(ulong)*_a[4],*_a[5]);
    goto LAB_0044cc18;
  case 0x46:
    pvVar11 = _a[1];
    uVar1 = *_a[2];
    pvVar10 = _a[3];
    uVar14 = (ulong)*_a[4];
    pp_Var8 = _o->_vptr_QObject;
    goto LAB_0044cb2a;
  case 0x47:
    pvVar11 = _a[1];
    uVar1 = *_a[2];
    pvVar10 = _a[3];
    pp_Var8 = _o->_vptr_QObject;
    uVar14 = 1;
LAB_0044cb2a:
    local_48 = (QArrayDataPointer<QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    local_5c._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_5c._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*pp_Var8[0x2a])(local_5c + 4,_o,pvVar11,(ulong)uVar1,pvVar10,uVar14,0x22);
LAB_0044cc18:
    if ((QArrayDataPointer<QModelIndex> *)*_a != (QArrayDataPointer<QModelIndex> *)0x0) {
      QArrayDataPointer<QModelIndex>::operator=
                ((QArrayDataPointer<QModelIndex> *)*_a,
                 (QArrayDataPointer<QModelIndex> *)(local_5c + 4));
    }
    if ((QArrayData *)local_5c._4_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_5c._4_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_5c._4_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_5c._4_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        objectSize = 0x18;
        data = (QArrayData *)local_5c._4_8_;
LAB_0044d062:
        QArrayData::deallocate(data,objectSize,0x10);
      }
    }
  default:
    goto switchD_0044c917_default;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractItemModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[3]))); break;
        case 1: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 2: _t->headerDataChanged((*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 3: _t->layoutChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemModel::LayoutChangeHint>>(_a[2]))); break;
        case 4: _t->layoutChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1]))); break;
        case 5: _t->layoutChanged(); break;
        case 6: _t->layoutAboutToBeChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemModel::LayoutChangeHint>>(_a[2]))); break;
        case 7: _t->layoutAboutToBeChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1]))); break;
        case 8: _t->layoutAboutToBeChanged(); break;
        case 9: _t->rowsAboutToBeInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 10: _t->rowsInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 11: _t->rowsAboutToBeRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 12: _t->rowsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 13: _t->columnsAboutToBeInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 14: _t->columnsInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 15: _t->columnsAboutToBeRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 16: _t->columnsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 17: _t->modelAboutToBeReset(QPrivateSignal()); break;
        case 18: _t->modelReset(QPrivateSignal()); break;
        case 19: _t->rowsAboutToBeMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 20: _t->rowsMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 21: _t->columnsAboutToBeMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 22: _t->columnsMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 23: { bool _r = _t->submit();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 24: _t->revert(); break;
        case 25: _t->resetInternalData(); break;
        case 26: { bool _r = _t->hasIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 27: { bool _r = _t->hasIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 28: { QModelIndex _r = _t->index((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 29: { QModelIndex _r = _t->index((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 30: { QModelIndex _r = _t->parent((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 31: { QModelIndex _r = _t->sibling((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 32: { int _r = _t->rowCount((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 33: { int _r = _t->rowCount();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 34: { int _r = _t->columnCount((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 35: { int _r = _t->columnCount();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 36: { bool _r = _t->hasChildren((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 37: { bool _r = _t->hasChildren();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 38: { QVariant _r = _t->data((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 39: { QVariant _r = _t->data((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 40: { bool _r = _t->setData((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 41: { bool _r = _t->setData((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 42: { QVariant _r = _t->headerData((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 43: { QVariant _r = _t->headerData((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 44: { bool _r = _t->insertRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 45: { bool _r = _t->insertRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 46: { bool _r = _t->insertColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 47: { bool _r = _t->insertColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 48: { bool _r = _t->removeRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 49: { bool _r = _t->removeRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 50: { bool _r = _t->removeColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 51: { bool _r = _t->removeColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 52: { bool _r = _t->moveRows((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 53: { bool _r = _t->moveColumns((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 54: { bool _r = _t->insertRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 55: { bool _r = _t->insertRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 56: { bool _r = _t->insertColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 57: { bool _r = _t->insertColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 58: { bool _r = _t->removeRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 59: { bool _r = _t->removeRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 60: { bool _r = _t->removeColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 61: { bool _r = _t->removeColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 62: { bool _r = _t->moveRow((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 63: { bool _r = _t->moveColumn((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 64: _t->fetchMore((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 65: { bool _r = _t->canFetchMore((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 66: { Qt::ItemFlags _r = _t->flags((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< Qt::ItemFlags*>(_a[0]) = std::move(_r); }  break;
        case 67: _t->sort((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::SortOrder>>(_a[2]))); break;
        case 68: _t->sort((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 69: { QModelIndexList _r = _t->match((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<Qt::MatchFlags>>(_a[5])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 70: { QModelIndexList _r = _t->match((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 71: { QModelIndexList _r = _t->match((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , const QModelIndex & , const QList<int> & )>(_a, &QAbstractItemModel::dataChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(Qt::Orientation , int , int )>(_a, &QAbstractItemModel::headerDataChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QList<QPersistentModelIndex> & , QAbstractItemModel::LayoutChangeHint )>(_a, &QAbstractItemModel::layoutChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QList<QPersistentModelIndex> & , QAbstractItemModel::LayoutChangeHint )>(_a, &QAbstractItemModel::layoutAboutToBeChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsAboutToBeInserted, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsInserted, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsAboutToBeRemoved, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsRemoved, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsAboutToBeInserted, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsInserted, 14))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsAboutToBeRemoved, 15))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsRemoved, 16))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(QPrivateSignal)>(_a, &QAbstractItemModel::modelAboutToBeReset, 17))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(QPrivateSignal)>(_a, &QAbstractItemModel::modelReset, 18))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsAboutToBeMoved, 19))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsMoved, 20))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsAboutToBeMoved, 21))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsMoved, 22))
            return;
    }
}